

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O0

VkSamplerAddressMode vk::mapWrapMode(WrapMode wrapMode)

{
  VkSamplerAddressMode local_c;
  WrapMode wrapMode_local;
  
  switch(wrapMode) {
  case CLAMP_TO_EDGE:
    local_c = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
    break;
  case CLAMP_TO_BORDER:
    local_c = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_BORDER;
    break;
  case REPEAT_GL:
    local_c = VK_SAMPLER_ADDRESS_MODE_REPEAT;
    break;
  default:
    local_c = VK_SAMPLER_ADDRESS_MODE_REPEAT;
    break;
  case MIRRORED_REPEAT_GL:
    local_c = VK_SAMPLER_ADDRESS_MODE_MIRRORED_REPEAT;
    break;
  case MIRRORED_ONCE:
    local_c = VK_SAMPLER_ADDRESS_MODE_MIRROR_CLAMP_TO_EDGE;
  }
  return local_c;
}

Assistant:

VkSamplerAddressMode mapWrapMode (tcu::Sampler::WrapMode wrapMode)
{
	switch (wrapMode)
	{
		case tcu::Sampler::CLAMP_TO_EDGE:		return VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
		case tcu::Sampler::CLAMP_TO_BORDER:		return VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_BORDER;
		case tcu::Sampler::REPEAT_GL:			return VK_SAMPLER_ADDRESS_MODE_REPEAT;
		case tcu::Sampler::MIRRORED_REPEAT_GL:	return VK_SAMPLER_ADDRESS_MODE_MIRRORED_REPEAT;
		case tcu::Sampler::MIRRORED_ONCE:		return VK_SAMPLER_ADDRESS_MODE_MIRROR_CLAMP_TO_EDGE;
		default:
			DE_FATAL("Wrap mode can't be mapped to Vulkan");
			return (vk::VkSamplerAddressMode)0;
	}
}